

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsOpacityEffect::draw(QGraphicsOpacityEffect *this,QPainter *painter)

{
  bool bVar1;
  char cVar2;
  undefined4 uVar3;
  qreal *pqVar4;
  long lVar5;
  QTransform *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  QPainter pixmapPainter;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  QPoint local_e0;
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  if ((*(byte *)(lVar5 + 0xb8) & 1) == 0) {
    if ((*(byte *)(lVar5 + 0xb8) & 6) == 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QGraphicsEffect::drawSource(&this->super_QGraphicsEffect,painter);
        return;
      }
      goto LAB_00375529;
    }
    local_e0.xp.m_i = 0;
    local_e0.yp.m_i = 0;
    bVar1 = QGraphicsEffect::sourceIsPixmap(&this->super_QGraphicsEffect);
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsEffect::sourcePixmap
              ((QGraphicsEffect *)local_f8,(CoordinateSystem)this,(QPoint *)(ulong)bVar1,
               (PixmapPadMode)&local_e0);
    cVar2 = QPixmap::isNull();
    if (cVar2 == '\0') {
      QPainter::save();
      QPainter::setOpacity(*(double *)(lVar5 + 0xa8));
      if ((*(byte *)(lVar5 + 0xb8) & 4) != 0) {
        _pixmapPainter = &DAT_aaaaaaaaaaaaaaaa;
        QPainter::QPainter(&pixmapPainter,(QPaintDevice *)local_f8);
        uVar3 = QPainter::renderHints();
        QPainter::setRenderHints(&pixmapPainter,uVar3,1);
        QPainter::setCompositionMode((CompositionMode)&pixmapPainter);
        if (bVar1) {
          local_88.m_matrix[0][0]._4_4_ = -local_e0.yp.m_i;
          local_88.m_matrix[0][0]._0_4_ = -local_e0.xp.m_i;
          QPainter::translate(&pixmapPainter,(QPoint *)&local_88);
          local_88.m_matrix[0]._0_16_ = QPixmap::rect();
          QPainter::fillRect((QRect *)&pixmapPainter,(QBrush *)&local_88);
        }
        else {
          pqVar4 = (qreal *)QPainter::worldTransform();
          pQVar6 = &local_88;
          for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
            pQVar6->m_matrix[0][0] = *pqVar4;
            pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
            pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar7 * -2 + 1) * 8);
          }
          QTransform::fromTranslate((double)-local_e0.xp.m_i,(double)-local_e0.yp.m_i);
          QTransform::operator*=(&local_88,&local_d8);
          QPainter::setWorldTransform((QTransform *)&pixmapPainter,SUB81(&local_88,0));
          QGraphicsEffect::sourceBoundingRect
                    ((QRectF *)&local_d8,&this->super_QGraphicsEffect,LogicalCoordinates);
          QPainter::fillRect((QRectF *)&pixmapPainter,(QBrush *)&local_d8);
        }
        QPainter::~QPainter(&pixmapPainter);
      }
      if (!bVar1) {
        pqVar4 = (qreal *)&DAT_006531e0;
        pQVar6 = &local_88;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          pQVar6->m_matrix[0][0] = *pqVar4;
          pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
          pQVar6 = (QTransform *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        local_88._72_2_ = 0;
        QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
      }
      QPainter::drawPixmap(painter,&local_e0,(QPixmap *)local_f8);
      QPainter::restore();
    }
    QPixmap::~QPixmap((QPixmap *)local_f8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00375529:
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsOpacityEffect);

    // Transparent; nothing to draw.
    if (d->isFullyTransparent)
        return;

    // Opaque; draw directly without going through a pixmap.
    if (d->isFullyOpaque && !d->hasOpacityMask) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    Qt::CoordinateSystem system = sourceIsPixmap() ? Qt::LogicalCoordinates : Qt::DeviceCoordinates;
    QPixmap pixmap = sourcePixmap(system, &offset, QGraphicsEffect::NoPad);
    if (pixmap.isNull())
        return;

    painter->save();
    painter->setOpacity(d->opacity);

    if (d->hasOpacityMask) {
        QPainter pixmapPainter(&pixmap);
        pixmapPainter.setRenderHints(painter->renderHints());
        pixmapPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        if (system == Qt::DeviceCoordinates) {
            QTransform worldTransform = painter->worldTransform();
            worldTransform *= QTransform::fromTranslate(-offset.x(), -offset.y());
            pixmapPainter.setWorldTransform(worldTransform);
            pixmapPainter.fillRect(sourceBoundingRect(), d->opacityMask);
        } else {
            pixmapPainter.translate(-offset);
            pixmapPainter.fillRect(pixmap.rect(), d->opacityMask);
        }
    }

    if (system == Qt::DeviceCoordinates)
        painter->setWorldTransform(QTransform());

    painter->drawPixmap(offset, pixmap);
    painter->restore();
}